

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitVariable
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,Variable v)

{
  int in_EDX;
  char *in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  BasicStringRef<char> *this_00;
  BasicWriter<char> *in_stack_ffffffffffffffc0;
  BasicStringRef<char> in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffdc;
  Reference local_8;
  
  this_00 = *(BasicStringRef<char> **)(in_RDI + 8);
  Reference::index(&local_8,in_RSI,in_EDX);
  GenericVarNamer::vname_abi_cxx11_(in_stack_ffffffffffffffdc);
  fmt::BasicStringRef<char>::BasicStringRef(this_00,in_stack_ffffffffffffff98);
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void VisitVariable(Variable v)
  { writer_ << vnam_.vname(v.index()); }